

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressiontoken.cpp
# Opt level: O3

int __thiscall PDA::Transducer::ExpressionToken::getPriority(ExpressionToken *this)

{
  wchar_t wVar1;
  
  wVar1 = this->m_charToken;
  if (wVar1 < L'+') {
    if ((uint)(wVar1 + L'\xffffffd8') < 2) {
      return (uint)((this->m_braceType & ~Priority) != Unassigned) << 2;
    }
    if ((wVar1 == L'%') || (wVar1 == L'*')) {
      return 3;
    }
  }
  else if (wVar1 < L'/') {
    if ((wVar1 == L'+') || (wVar1 == L'-')) {
      return 2;
    }
  }
  else {
    if (wVar1 == L'/') {
      return 3;
    }
    if (wVar1 == L';') {
      return 1;
    }
  }
  return -1;
}

Assistant:

int ExpressionToken::getPriority() const
{
    if (m_charToken == L';')
        return 1;
    else if (m_charToken == L'-' || m_charToken == L'+')
        return 2;
    else if (m_charToken == L'*' || m_charToken == L'/' || m_charToken == L'%')
        return 3;
    else if (m_charToken == L')' || m_charToken == L'(')
    {
        if (m_braceType == BraceType::Priority || m_braceType == BraceType::Unassigned)
            return 0;
        else
            return 4;
    }
    return -1;
}